

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  bool bVar4;
  allocator<char> *__rhs;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 uVar5;
  ostream *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  int local_164;
  string local_160;
  allocator<char> local_139;
  string local_138 [32];
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  string local_78;
  int local_54;
  string local_50 [4];
  int gtest_retval;
  GTestLog local_30 [5];
  undefined1 local_1c [12];
  int bytes_read;
  char flag;
  DeathTestImpl *this_local;
  
  _bytes_read = this;
  do {
    iVar1 = read_fd(this);
    local_1c._4_4_ = posix::Read(iVar1,local_1c + 0xb,1);
    bVar4 = false;
    if (local_1c._4_4_ == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (local_1c._4_4_ == 0) {
    set_outcome(this,DIED);
  }
  else if (local_1c._4_4_ == 1) {
    switch(local_1c[0xb]) {
    case 'I':
      iVar1 = read_fd(this);
      FailFromInternalError(iVar1);
      break;
    default:
      in_stack_fffffffffffffe70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c;
      GTestLog::GTestLog((GTestLog *)in_stack_fffffffffffffe70,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/lib/gtest/googletest/src/gtest-death-test.cc"
                         ,0x1d1);
      poVar3 = GTestLog::GetStream((GTestLog *)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe68 = std::operator<<(poVar3,"Death test child process reported ");
      in_stack_fffffffffffffe60 =
           std::operator<<(in_stack_fffffffffffffe68,"unexpected status byte (");
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe60,(int)local_1c[0xb]);
      std::operator<<(poVar3,")");
      GTestLog::~GTestLog((GTestLog *)local_1c);
      break;
    case 'L':
      set_outcome(this,LIVED);
      break;
    case 'R':
      set_outcome(this,RETURNED);
      break;
    case 'T':
      set_outcome(this,THREW);
    }
  }
  else {
    GTestLog::GTestLog(local_30,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/lib/gtest/googletest/src/gtest-death-test.cc"
                       ,0x1d6);
    poVar3 = GTestLog::GetStream(local_30);
    poVar3 = std::operator<<(poVar3,"Read from death test child process failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator<<(poVar3,local_50);
    std::__cxx11::string::~string(local_50);
    GTestLog::~GTestLog(local_30);
  }
  do {
    do {
      iVar1 = read_fd(this);
      local_54 = posix::Close(iVar1);
      uVar5 = false;
      if (local_54 == -1) {
        piVar2 = __errno_location();
        uVar5 = *piVar2 == 4;
      }
    } while ((bool)uVar5 != false);
    if (local_54 == -1) {
      __rhs = &local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                 (allocator<char> *)in_stack_fffffffffffffe60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffffe38),(char *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffffe38),(char *)__rhs);
      local_164 = 0x1d9;
      StreamableToString<int>(&local_160,&local_164);
      std::operator+(&local_d8,&local_f8,&local_160);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffffe38),(char *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffffe38),(char *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffffe38),(char *)__rhs);
      DeathTestAbort(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    bVar4 = AlwaysFalse();
  } while (bVar4);
  set_read_fd(this,-1);
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}